

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Statement *
slang::ast::ForeachLoopStatement::fromSyntax
          (Compilation *compilation,ForeachLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  sockaddr *__addr;
  bool bVar1;
  int iVar2;
  int iVar3;
  NameSyntax *pNVar4;
  undefined4 extraout_var;
  IteratorSymbol *pIVar5;
  reference pLVar6;
  StatementSyntax *pSVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Compilation *pCVar8;
  undefined8 in_RCX;
  sockaddr *in_RDX;
  EVP_PKEY_CTX *src;
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *extraout_RDX;
  SourceRange *in_RDI;
  ForeachLoopStatement *result;
  Statement *bodyStmt;
  IteratorSymbol *it;
  NameSyntax *loopVar;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  specific_symbol_iterator<slang::ast::IteratorSymbol> itIt;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_(std::ranges::subrange_kind)0>
  range;
  Type *type;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  Expression *arrayRef;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  Type *in_stack_fffffffffffffd48;
  Compilation *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  Scope *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd70;
  StatementContext *in_stack_fffffffffffffd78;
  Statement *args_2;
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *args_1;
  Statement *this;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_(std::ranges::subrange_kind)0>
  local_f0;
  Type *local_e0;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> local_d8 [2];
  bitmask<slang::ast::ASTFlags> local_60 [3];
  Statement *local_48;
  undefined8 local_28;
  sockaddr *local_20;
  SourceRange *local_10;
  Compilation *local_8;
  Expression *args;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  Statement::StatementContext::enterLoop
            (in_stack_fffffffffffffd78,SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0));
  not_null<slang::syntax::ForeachLoopListSyntax_*>::operator->
            ((not_null<slang::syntax::ForeachLoopListSyntax_*> *)0x13b7b3f);
  pNVar4 = not_null<slang::syntax::NameSyntax_*>::operator*
                     ((not_null<slang::syntax::NameSyntax_*> *)0x13b7b5a);
  __addr = local_20;
  bitmask<slang::ast::ASTFlags>::bitmask(local_60,None);
  iVar2 = Expression::bind((int)pNVar4,__addr,(socklen_t)local_60[0].m_bits);
  local_48 = (Statement *)CONCAT44(extraout_var,iVar2);
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL>::SmallVector
            ((SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *)0x13b7bcd);
  local_e0 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x13b7bde);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x13b7c05);
  local_f0 = Scope::membersOfType<slang::ast::IteratorSymbol>(in_stack_fffffffffffffd60);
  std::ranges::
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_(std::ranges::subrange_kind)0>
  ::begin(&local_f0);
  not_null<slang::syntax::ForeachLoopListSyntax_*>::operator->
            ((not_null<slang::syntax::ForeachLoopListSyntax_*> *)0x13b7c86);
  slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x13b7cb1);
  slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)in_stack_fffffffffffffd50);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffd50,
                       (iterator_base<slang::syntax::NameSyntax_*> *)in_stack_fffffffffffffd48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pNVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                          *)0x13b7d5f);
    bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffd50);
    if (bVar1) {
      Type::getFixedRange(in_stack_fffffffffffffd48);
      std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                ((optional<slang::ConstantRange> *)in_stack_fffffffffffffd50,
                 (ConstantRange *)in_stack_fffffffffffffd48);
      SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::push_back
                ((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                 in_stack_fffffffffffffd50,(LoopDim *)in_stack_fffffffffffffd48);
    }
    else {
      SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>
                ((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                 CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    }
    local_e0 = Type::getArrayElementType
                         ((Type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    if ((pNVar4->super_ExpressionSyntax).super_SyntaxNode.kind != EmptyIdentifierName) {
      pIVar5 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_false>
               ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_false>
                            *)0x13b7eb5);
      pLVar6 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::back(local_d8);
      pLVar6->loopVar = pIVar5;
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_false>
                  *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                 (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                *)in_stack_fffffffffffffd50);
  }
  pSVar7 = not_null<slang::syntax::StatementSyntax_*>::operator*
                     ((not_null<slang::syntax::StatementSyntax_*> *)0x13b7f4c);
  iVar2 = Statement::bind((int)pSVar7,local_20,(socklen_t)local_28);
  args_2 = local_48;
  this = (Statement *)CONCAT44(extraout_var_00,iVar2);
  iVar3 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::copy
                    (local_d8,(EVP_PKEY_CTX *)local_10,src);
  args = (Expression *)CONCAT44(extraout_var_01,iVar3);
  args_1 = extraout_RDX;
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
  pCVar8 = (Compilation *)
           BumpAllocator::
           emplace<slang::ast::ForeachLoopStatement,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                     ((BumpAllocator *)this,args,args_1,args_2,local_10);
  bVar1 = Statement::bad((Statement *)CONCAT44(extraout_var_00,iVar2));
  local_8 = pCVar8;
  if (bVar1) {
    in_stack_fffffffffffffd50 =
         (Compilation *)
         Statement::badStmt(in_stack_fffffffffffffd50,(Statement *)in_stack_fffffffffffffd48);
    local_8 = in_stack_fffffffffffffd50;
  }
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL>::~SmallVector
            ((SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *)0x13b80c7);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
                 *)in_stack_fffffffffffffd50);
  return (Statement *)local_8;
}

Assistant:

Statement& ForeachLoopStatement::fromSyntax(Compilation& compilation,
                                            const ForeachLoopStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    auto& arrayRef = Expression::bind(*syntax.loopList->arrayName, context);
    SLANG_ASSERT(!arrayRef.bad());

    // Loop variables were already built in the containing block when it was elaborated,
    // so we just have to find them and associate them with the correct dim ranges here.
    SmallVector<LoopDim, 4> dims;
    const Type* type = arrayRef.type;
    auto range = context.scope->membersOfType<IteratorSymbol>();
    auto itIt = range.begin();

    for (auto loopVar : syntax.loopList->loopVariables) {
        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        type = type->getArrayElementType();

        if (loopVar->kind == SyntaxKind::EmptyIdentifierName)
            continue;

        SLANG_ASSERT(itIt != range.end());
        SLANG_ASSERT(itIt->name == loopVar->as<IdentifierNameSyntax>().identifier.valueText());

        IteratorSymbol* it = const_cast<IteratorSymbol*>(&*itIt);
        dims.back().loopVar = it;
        itIt++;
    }

    SLANG_ASSERT(itIt == range.end());

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<ForeachLoopStatement>(arrayRef, dims.copy(compilation),
                                                            bodyStmt, syntax.sourceRange());
    if (bodyStmt.bad())
        return badStmt(compilation, result);
    return *result;
}